

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  bool bVar1;
  _Bool _Var2;
  time_t tVar3;
  Curl_llist_node *n;
  altsvc *paVar4;
  Curl_llist_node *pCVar5;
  int iVar6;
  
  tVar3 = time((time_t *)0x0);
  n = Curl_llist_head(&asi->list);
  do {
    bVar1 = n != (Curl_llist_node *)0x0;
    if (!bVar1) {
      return bVar1;
    }
    paVar4 = (altsvc *)Curl_node_elem(n);
    pCVar5 = Curl_node_next(n);
    if (paVar4->expires < tVar3) {
      Curl_node_remove(n);
      (*Curl_cfree)((paVar4->src).host);
      (*Curl_cfree)((paVar4->dst).host);
      (*Curl_cfree)(paVar4);
      iVar6 = 10;
    }
    else {
      iVar6 = 0;
      if (((((paVar4->src).alpnid == srcalpnid) &&
           (_Var2 = hostcompare(srchost,(paVar4->src).host), _Var2)) &&
          ((uint)(paVar4->src).port == srcport)) && (((paVar4->dst).alpnid & versions) != ALPN_none)
         ) {
        *dstentry = paVar4;
        iVar6 = 1;
      }
    }
    n = pCVar5;
  } while ((iVar6 == 10) || (iVar6 == 0));
  return bVar1;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = Curl_llist_head(&asi->list); e; e = n) {
    struct altsvc *as = Curl_node_elem(e);
    n = Curl_node_next(e);
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_node_remove(e);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       hostcompare(srchost, as->src.host) &&
       (as->src.port == srcport) &&
       (versions & (int)as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}